

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackDebGenerator::PackageOnePack
          (cmCPackDebGenerator *this,string *initialTopLevel,string *packageName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar2;
  pointer pcVar3;
  cmCPackLog *this_00;
  size_t msg;
  bool bVar4;
  string *psVar5;
  long *plVar6;
  size_t length;
  size_type *psVar7;
  uint uVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string component_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string outputFileName;
  string localToplevel;
  string packageFileName;
  ostringstream cmCPackLog_msg;
  string local_258;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_238;
  size_type local_220;
  pointer local_218;
  undefined8 local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  undefined1 local_1a8 [24];
  char acStack_190 [88];
  ios_base local_138 [264];
  
  local_1e8[0] = local_1d8;
  pcVar3 = (initialTopLevel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar3,pcVar3 + initialTopLevel->_M_string_length);
  cmsys::SystemTools::GetParentDirectory(&local_1c8,&(this->super_cmCPackGenerator).toplevel);
  paVar1 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CPACK_PACKAGE_FILE_NAME","")
  ;
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_258);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  ppbVar2 = &local_238.second;
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_238.first._M_len = (size_t)ppbVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar3,pcVar3 + psVar5->_M_string_length);
  std::__cxx11::string::append((char *)&local_238);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_238,(ulong)(packageName->_M_dataplus)._M_p);
  pcVar3 = local_1a8 + 0x10;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    local_1a8._16_8_ = *psVar7;
    acStack_190._0_4_ = (undefined4)plVar6[3];
    acStack_190._4_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_1a8._0_8_ = pcVar3;
  }
  else {
    local_1a8._16_8_ = *psVar7;
    local_1a8._0_8_ = (size_type *)*plVar6;
  }
  local_1a8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  plVar6 = (long *)std::__cxx11::string::append(local_1a8);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208.field_2._8_8_ = plVar6[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar7;
    local_208._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_208._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_238.first._M_len
      != ppbVar2) {
    operator_delete((void *)local_238.first._M_len,
                    (ulong)((long)&((local_238.second)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,"/",
                 packageName);
  std::__cxx11::string::_M_append((char *)local_1e8,local_1a8._0_8_);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_DIRECTORY","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,(string *)local_1e8)
  ;
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,"/",
                 &local_208);
  std::__cxx11::string::_M_append((char *)&local_1c8,local_1a8._0_8_);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_OUTPUT_FILE_NAME","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_208);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_1c8);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_DEB_PACKAGE_COMPONENT","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_1a8,(cmValue)packageName);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_238.first._M_str = acStack_190;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = 1;
  acStack_190[0] = 0x2f;
  local_238.first._M_len = (size_t)&DAT_00000001;
  local_238.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_218 = (packageName->_M_dataplus)._M_p;
  local_220 = packageName->_M_string_length;
  local_210 = 0;
  views._M_len = 2;
  views._M_array = &local_238;
  local_1a8._16_8_ = local_238.first._M_str;
  cmCatViews(&local_258,views);
  local_1a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH","");
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_1a8,&local_258);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  bVar4 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackDeb.cmake");
  if (bVar4) {
    bVar4 = createDebPackages(this);
    uVar8 = (uint)bVar4;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error while execution CPackDeb.cmake",0x24);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    msg = local_238.first._M_len;
    length = strlen((char *)local_238.first._M_len);
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x231,(char *)msg,length);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_238.first._M_len
        != ppbVar2) {
      operator_delete((void *)local_238.first._M_len,
                      (ulong)((long)&((local_238.second)->_M_dataplus)._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  return uVar8;
}

Assistant:

int cmCPackDebGenerator::PackageOnePack(std::string const& initialTopLevel,
                                        std::string const& packageName)
{
  // Begin the archive for this pack
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(
    cmSystemTools::GetParentDirectory(this->toplevel));
  std::string outputFileName(*this->GetOption("CPACK_PACKAGE_FILE_NAME") +
                             "-" + packageName + this->GetOutputExtension());

  localToplevel += "/" + packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel);
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName);
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME", packageFileName);
  // Tell CPackDeb.cmake the name of the component GROUP.
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT", packageName);
  // Tell CPackDeb.cmake the path where the component is.
  std::string component_path = cmStrCat('/', packageName);
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH", component_path);
  if (!this->ReadListFile("Internal/CPack/CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackDeb.cmake" << std::endl);
    return 0;
  }

  return this->createDebPackages();
}